

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallScriptGenerator::GetScript
          (string *__return_storage_ptr__,cmInstallScriptGenerator *this,string *config)

{
  cmLocalGenerator *lg;
  string *config_00;
  string local_c0;
  string local_a0;
  string local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 local_21;
  string *local_20;
  string *config_local;
  cmInstallScriptGenerator *this_local;
  string *script;
  
  local_21 = 0;
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmInstallScriptGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Script);
  if (((this->AllowGenex & 1U) != 0) &&
     (((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig & 1U) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"${CMAKE_INSTALL_PREFIX}",&local_49);
    cmGeneratorExpression::ReplaceInstallPrefix(__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    std::__cxx11::string::string((string *)&local_a0,(string *)__return_storage_ptr__);
    config_00 = local_20;
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_c0);
    cmGeneratorExpression::Evaluate
              (&local_80,&local_a0,lg,config_00,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_c0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallScriptGenerator::GetScript(
  std::string const& config) const
{
  std::string script = this->Script;
  if (this->AllowGenex && this->ActionsPerConfig) {
    cmGeneratorExpression::ReplaceInstallPrefix(script,
                                                "${CMAKE_INSTALL_PREFIX}");
    script =
      cmGeneratorExpression::Evaluate(script, this->LocalGenerator, config);
  }
  return script;
}